

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O2

void __thiscall
soplex::
DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setMax(DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int newmax)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **p;
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *newmem;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  uVar1 = (this->
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).memused;
  if (newmax < (int)uVar1) {
    newmax = uVar1;
  }
  if (newmax != (this->
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).memsize) {
    local_38 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
    spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
              (&local_38,newmax);
    p = &this->theelem;
    lVar4 = 0;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    for (; uVar3 * 0x84 - lVar4 != 0; lVar4 = lVar4 + 0x84) {
      Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::Nonzero((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)(local_38->val).m_backend.data._M_elems + lVar4),
                (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)((*p)->val).m_backend.data._M_elems + lVar4));
    }
    piVar2 = &local_38[uVar3].idx;
    for (; (long)uVar3 < (long)newmax; uVar3 = uVar3 + 1) {
      *(undefined8 *)(piVar2 + -2) = 0x1c00000000;
      (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)(piVar2 + -0x20))->val).m_backend.data._M_elems[0] = 0;
      (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)(piVar2 + -0x20))->val).m_backend.data._M_elems[1] = 0;
      (piVar2 + -0x1e)[0] = 0;
      (piVar2 + -0x1e)[1] = 0;
      (piVar2 + -0x1c)[0] = 0;
      (piVar2 + -0x1c)[1] = 0;
      (piVar2 + -0x1a)[0] = 0;
      (piVar2 + -0x1a)[1] = 0;
      (piVar2 + -0x18)[0] = 0;
      (piVar2 + -0x18)[1] = 0;
      (piVar2 + -0x16)[0] = 0;
      (piVar2 + -0x16)[1] = 0;
      (piVar2 + -0x14)[0] = 0;
      (piVar2 + -0x14)[1] = 0;
      (piVar2 + -0x12)[0] = 0;
      (piVar2 + -0x12)[1] = 0;
      (piVar2 + -0x10)[0] = 0;
      (piVar2 + -0x10)[1] = 0;
      (piVar2 + -0xe)[0] = 0;
      (piVar2 + -0xe)[1] = 0;
      (piVar2 + -8)[0] = 0;
      (piVar2 + -8)[1] = 0;
      (piVar2 + -6)[0] = 0;
      (piVar2 + -6)[1] = 0;
      *(undefined8 *)((long)piVar2 + -0x13) = 0;
      (piVar2 + -0xc)[0] = 0;
      (piVar2 + -0xc)[1] = 0;
      (piVar2 + -10)[0] = 0;
      (piVar2 + -10)[1] = 0;
      *piVar2 = 0;
      piVar2 = piVar2 + 0x21;
    }
    if (*p != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x0) {
      spx_free<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>*>
                (p);
    }
    this->theelem = local_38;
    (this->
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).m_elem = local_38;
    (this->
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).memsize = newmax;
    (this->
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).memused = uVar1;
  }
  return;
}

Assistant:

void setMax(int newmax = 1)
   {
      int siz = SVectorBase<R>::size();
      int len = (newmax < siz) ? siz : newmax;

      if(len == SVectorBase<R>::max())
         return;

      Nonzero<R>* newmem = nullptr;

      /* allocate new memory */
      spx_alloc(newmem, len);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < siz; i++)
         new((&newmem[i])) Nonzero<R>(theelem[i]);

      /* call default constructor for remaining elements */
      for(; i < len; i++)
         new((&newmem[i])) Nonzero<R>();

      /* free old memory */
      for(i = SVectorBase<R>::max() - 1; i >= 0; i--)
         theelem[i].~Nonzero<R>();

      if(theelem != nullptr)
         spx_free(theelem);

      /* assign new memory */
      theelem = newmem;
      SVectorBase<R>::setMem(len, theelem);
      SVectorBase<R>::set_size(siz);
   }